

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

string * __thiscall
args::CompletionFlag::Get_abi_cxx11_(string *__return_storage_ptr__,CompletionFlag *this)

{
  string *in_RCX;
  allocator local_39;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  CompletionFlag *local_18;
  CompletionFlag *this_local;
  
  local_18 = this;
  this_local = (CompletionFlag *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"\n",&local_39);
  detail::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (__return_storage_ptr__,(detail *)&this->reply,&local_38,in_RCX);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return __return_storage_ptr__;
}

Assistant:

std::string Get() noexcept
            {
                return detail::Join(reply, "\n");
            }